

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O1

BrailleCanvas * __thiscall
plot::BrailleCanvas::rect
          (BrailleCanvas *this,Color *stroke_color,Color *fill_color,Rect rct,TerminalOp op)

{
  Rect rct_00;
  BrailleCanvas *pBVar1;
  long lVar2;
  long lVar3;
  Point from;
  Point from_00;
  Point from_01;
  Point from_02;
  Point to;
  Point to_00;
  Point to_01;
  Point to_02;
  anon_class_32_1_54a39812 local_50;
  
  lVar3 = rct.p2.x;
  if (rct.p1.x < rct.p2.x) {
    lVar3 = rct.p1.x;
  }
  if (rct.p2.x < rct.p1.x) {
    rct.p2.x = rct.p1.x;
  }
  lVar2 = rct.p2.y;
  if (rct.p1.y < rct.p2.y) {
    lVar2 = rct.p1.y;
  }
  if (rct.p2.y < rct.p1.y) {
    rct.p2.y = rct.p1.y;
  }
  pBVar1 = push(this);
  from.y = lVar2;
  from.x = lVar3;
  to.y = lVar2;
  to.x = rct.p2.x;
  pBVar1 = line(pBVar1,stroke_color,from,to,Over);
  from_00.y = lVar2;
  from_00.x = lVar3;
  to_00.y = rct.p2.y;
  to_00.x = lVar3;
  pBVar1 = line(pBVar1,stroke_color,from_00,to_00,Over);
  from_01.y = rct.p2.y;
  from_01.x = rct.p2.x;
  to_01.y = lVar2;
  to_01.x = rct.p2.x;
  pBVar1 = line(pBVar1,stroke_color,from_01,to_01,Over);
  from_02.y = rct.p2.y;
  from_02.x = rct.p2.x;
  to_02.y = rct.p2.y;
  to_02.x = lVar3;
  pBVar1 = line(pBVar1,stroke_color,from_02,to_02,Over);
  local_50.r.p1.x = lVar3 + 1;
  local_50.r.p1.y = lVar2 + 1;
  rct_00.p1.y = lVar2;
  rct_00.p1.x = lVar3;
  rct_00.p2.x = rct.p2.x;
  rct_00.p2.y = rct.p2.y;
  local_50.r.p2.x = rct.p2.x;
  local_50.r.p2.y = rct.p2.y;
  pBVar1 = fill<plot::BrailleCanvas::rect(plot::Color_const&,plot::Color_const&,plot::GenericRect<long>,plot::TerminalOp)::_lambda(plot::GenericPoint<long>)_1_>
                     (pBVar1,fill_color,rct_00,&local_50,Over);
  pBVar1 = pop(pBVar1,op);
  return pBVar1;
}

Assistant:

BrailleCanvas& rect(Color const& stroke_color, Color const& fill_color, Rect rct, TerminalOp op = TerminalOp::Over) {
        rct = rct.sorted();
        return push()
              .line(stroke_color, rct.p1, { rct.p2.x, rct.p1.y }, TerminalOp::Over)
              .line(stroke_color, rct.p1, { rct.p1.x, rct.p2.y }, TerminalOp::Over)
              .line(stroke_color, rct.p2, { rct.p2.x, rct.p1.y }, TerminalOp::Over)
              .line(stroke_color, rct.p2, { rct.p1.x, rct.p2.y }, TerminalOp::Over)
              .fill(fill_color, rct, [r=Rect(rct.p1 + Point(1, 1), rct.p2)](Point p) {
                  return r.contains(p);
              }, TerminalOp::Over)
              .pop(op);
    }